

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmRST.cxx
# Opt level: O2

bool __thiscall cmRST::ProcessInclude(cmRST *this,string *file,IncludeType type)

{
  ostream *os;
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  cmRST r;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_db0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d90;
  string local_d70;
  cmRST local_d50;
  
  if (this->IncludeDepth < 10) {
    os = this->OS;
    std::__cxx11::string::string((string *)&local_d70,(string *)&this->DocRoot);
    cmRST(&local_d50,os,&local_d70);
    std::__cxx11::string::~string((string *)&local_d70);
    local_d50.IncludeDepth = this->IncludeDepth + 1;
    local_d50.OutputLinePending = this->OutputLinePending;
    if (type != IncludeTocTree) {
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator=(&local_d50.Replace._M_t,&(this->Replace)._M_t);
    }
    if (*(file->_M_dataplus)._M_p == '/') {
      std::operator+(&local_d90,&this->DocRoot,file);
      this_00 = &local_d90;
      std::__cxx11::string::operator=((string *)file,(string *)this_00);
    }
    else {
      std::operator+(&local_db0,&this->DocDir,"/");
      std::operator+(&local_d90,&local_db0,file);
      std::__cxx11::string::operator=((string *)file,(string *)&local_d90);
      std::__cxx11::string::~string((string *)&local_d90);
      this_00 = &local_db0;
    }
    std::__cxx11::string::~string((string *)this_00);
    bVar1 = ProcessFile(&local_d50,file,type == IncludeModule);
    if (type != IncludeTocTree) {
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator=(&(this->Replace)._M_t,&local_d50.Replace._M_t);
    }
    this->OutputLinePending = local_d50.OutputLinePending;
    ~cmRST(&local_d50);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool cmRST::ProcessInclude(std::string file, IncludeType type)
{
  bool found = false;
  if (this->IncludeDepth < 10) {
    cmRST r(this->OS, this->DocRoot);
    r.IncludeDepth = this->IncludeDepth + 1;
    r.OutputLinePending = this->OutputLinePending;
    if (type != IncludeTocTree) {
      r.Replace = this->Replace;
    }
    if (file[0] == '/') {
      file = this->DocRoot + file;
    } else {
      file = this->DocDir + "/" + file;
    }
    found = r.ProcessFile(file, type == IncludeModule);
    if (type != IncludeTocTree) {
      this->Replace = r.Replace;
    }
    this->OutputLinePending = r.OutputLinePending;
  }
  return found;
}